

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
CustomLayerParams_CustomLayerParamValue
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  bool value;
  ValueCase VVar1;
  int32 value_00;
  InternalMetadataWithArenaLite *this_00;
  string *value_01;
  int64 value_02;
  double value_03;
  CustomLayerParams_CustomLayerParamValue *from_local;
  CustomLayerParams_CustomLayerParamValue *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomLayerParams_CustomLayerParamValue_0056f118;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  ValueUnion::ValueUnion((ValueUnion *)&(this->value_).stringvalue_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  clear_has_value(this);
  VVar1 = value_case(from);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    value_03 = doublevalue(from);
    set_doublevalue(this,value_03);
    break;
  case kStringValue:
    value_01 = stringvalue_abi_cxx11_(from);
    set_stringvalue(this,value_01);
    break;
  case kIntValue:
    value_00 = intvalue(from);
    set_intvalue(this,value_00);
    break;
  case kLongValue:
    value_02 = longvalue(from);
    set_longvalue(this,value_02);
    break;
  case kBoolValue:
    value = boolvalue(from);
    set_boolvalue(this,value);
  }
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::CustomLayerParams_CustomLayerParamValue(const CustomLayerParams_CustomLayerParamValue& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      set_doublevalue(from.doublevalue());
      break;
    }
    case kStringValue: {
      set_stringvalue(from.stringvalue());
      break;
    }
    case kIntValue: {
      set_intvalue(from.intvalue());
      break;
    }
    case kLongValue: {
      set_longvalue(from.longvalue());
      break;
    }
    case kBoolValue: {
      set_boolvalue(from.boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}